

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *testdata_dir;
  __normal_iterator<Testdata_*,_std::vector<Testdata,_std::allocator<Testdata>_>_> local_148;
  __normal_iterator<Testdata_const*,std::vector<Testdata,std::allocator<Testdata>>> local_140 [8];
  __normal_iterator<Testdata_*,_std::vector<Testdata,_std::allocator<Testdata>_>_> local_138;
  __normal_iterator<Testdata_const*,std::vector<Testdata,std::allocator<Testdata>>> local_130 [12];
  undefined4 local_124;
  string local_120 [32];
  undefined1 local_100 [8];
  vector<Testdata,_std::allocator<Testdata>_> testdata;
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  string rootdir;
  char *local_20;
  char *template_rootdir;
  char **argv_local;
  int argc_local;
  
  local_20 = getenv("TEMPLATE_ROOTDIR");
  if (local_20 == (char *)0x0) {
    local_20 = ".";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,local_20,&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"src",&local_99);
  ctemplate::PathJoin(local_40,local_60);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"tests",
             (allocator *)
             ((long)&testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  ctemplate::PathJoin(local_c0,local_40);
  std::__cxx11::string::operator=(local_40,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&testdata.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  ctemplate::Template::SetTemplateRootDirectory((string *)local_40);
  ctemplate::Template::template_root_directory_abi_cxx11_();
  testdata_dir = (char *)std::__cxx11::string::c_str();
  ReadDataFiles((vector<Testdata,_std::allocator<Testdata>_> *)local_100,testdata_dir);
  std::__cxx11::string::~string(local_120);
  bVar1 = std::vector<Testdata,_std::allocator<Testdata>_>::empty
                    ((vector<Testdata,_std::allocator<Testdata>_> *)local_100);
  if (bVar1) {
    printf("FATAL ERROR: No test files found for template_regtest\n");
  }
  else {
    local_138._M_current =
         (Testdata *)
         std::vector<Testdata,_std::allocator<Testdata>_>::begin
                   ((vector<Testdata,_std::allocator<Testdata>_> *)local_100);
    __gnu_cxx::__normal_iterator<Testdata_const*,std::vector<Testdata,std::allocator<Testdata>>>::
    __normal_iterator<Testdata*>(local_130,&local_138);
    local_148._M_current =
         (Testdata *)
         std::vector<Testdata,_std::allocator<Testdata>_>::end
                   ((vector<Testdata,_std::allocator<Testdata>_> *)local_100);
    __gnu_cxx::__normal_iterator<Testdata_const*,std::vector<Testdata,std::allocator<Testdata>>>::
    __normal_iterator<Testdata*>(local_140,&local_148);
    TestExpand((const_iterator *)local_130,(const_iterator *)local_140);
    printf("DONE\n");
  }
  argv_local._4_4_ = (uint)bVar1;
  local_124 = 1;
  std::vector<Testdata,_std::allocator<Testdata>_>::~vector
            ((vector<Testdata,_std::allocator<Testdata>_> *)local_100);
  std::__cxx11::string::~string(local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string rootdir = GOOGLE_NAMESPACE::PathJoin(template_rootdir, "src");
  rootdir = GOOGLE_NAMESPACE::PathJoin(rootdir, "tests");
  Template::SetTemplateRootDirectory(rootdir);

  vector<Testdata> testdata = ReadDataFiles(
      Template::template_root_directory().c_str());
  if (testdata.empty()) {
    printf("FATAL ERROR: No test files found for template_regtest\n");
    return 1;
  }

  TestExpand(testdata.begin(), testdata.end());

  printf("DONE\n");
  return 0;
}